

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_callWithContextNoResult3
               (sysbvm_bytecodeJit_t *jit,void *functionPointer,int16_t argumentOperand0,
               int16_t argumentOperand1,int16_t argumentOperand2)

{
  int16_t argumentOperand2_local;
  int16_t argumentOperand1_local;
  int16_t argumentOperand0_local;
  void *functionPointer_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  sysbvm_jit_x86_jitLoadContextInRegister(jit,SYSBVM_X86_64_ARG0);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,argumentOperand0);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG2,argumentOperand1);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG3,argumentOperand2);
  sysbvm_jit_x86_call(jit,functionPointer);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_callWithContextNoResult3(sysbvm_bytecodeJit_t *jit, void *functionPointer, int16_t argumentOperand0, int16_t argumentOperand1, int16_t argumentOperand2)
{
    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, argumentOperand0);
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG2, argumentOperand1);
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG3, argumentOperand2);
    sysbvm_jit_x86_call(jit, functionPointer);
}